

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test::
testBody(TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test
         *this)

{
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeNewByTemporarlySwitchingOffNew)
{
#ifdef CPPUTEST_USE_NEW_MACROS
    #undef new
    #undef delete
#endif
    char* memory = new char[10];
    delete [] memory;
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}